

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int update_max_streams(st_quicly_max_streams_t *m,uint64_t count)

{
  uint64_t count_local;
  st_quicly_max_streams_t *m_local;
  int local_4;
  
  if (count < 0x1000000000000001) {
    if ((m->count < count) && (m->count = count, (ulong)(m->blocked_sender).max_acked < count)) {
      (m->blocked_sender).max_acked = count;
    }
    local_4 = 0;
  }
  else {
    local_4 = 0x20004;
  }
  return local_4;
}

Assistant:

static int update_max_streams(struct st_quicly_max_streams_t *m, uint64_t count)
{
    if (count > (uint64_t)1 << 60)
        return QUICLY_TRANSPORT_ERROR_STREAM_LIMIT;

    if (m->count < count) {
        m->count = count;
        if (m->blocked_sender.max_acked < count)
            m->blocked_sender.max_acked = count;
    }

    return 0;
}